

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildKey.h
# Opt level: O2

void __thiscall
llbuild::buildsystem::BuildKey::BuildKey<llvm::StringRef>
          (BuildKey *this,char kindCode,StringRef name,StringRef *data)

{
  int iVar1;
  pointer __dest;
  ulong uVar2;
  string encodedKey;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_160;
  BinaryEncoder encoder;
  
  (this->key).key._M_dataplus._M_p = (pointer)&(this->key).key.field_2;
  (this->key).key._M_string_length = 0;
  (this->key).key.field_2._M_local_buf[0] = '\0';
  encoder.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.BeginX =
       &encoder.encdata.super_SmallVectorStorage<unsigned_char,_256U>;
  encoder.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size = 0;
  encoder.encdata.super_SmallVectorImpl<unsigned_char>.
  super_SmallVectorTemplateBase<unsigned_char,_true>.
  super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Capacity = 0x100;
  basic::BinaryCodingTraits<llvm::StringRef>::encode(data,&encoder);
  basic::BinaryEncoder::contents
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&encodedKey,&encoder);
  uVar2 = encodedKey._M_string_length - (long)encodedKey._M_dataplus._M_p;
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&encodedKey);
  encodedKey._M_dataplus._M_p = (pointer)&encodedKey.field_2;
  encodedKey._M_string_length = 0;
  encodedKey.field_2._M_local_buf[0] = '\0';
  iVar1 = (int)name.Length;
  std::__cxx11::string::resize((ulong)&encodedKey);
  *encodedKey._M_dataplus._M_p = kindCode;
  *(int *)(encodedKey._M_dataplus._M_p + 1) = iVar1;
  memcpy(encodedKey._M_dataplus._M_p + 5,name.Data,name.Length & 0xffffffff);
  __dest = encodedKey._M_dataplus._M_p + (iVar1 + 5);
  basic::BinaryEncoder::contents
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_160,&encoder);
  memcpy(__dest,local_160._M_impl.super__Vector_impl_data._M_start,uVar2 & 0xffffffff);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_160);
  if (encodedKey._M_string_length == iVar1 + (int)uVar2 + 5) {
    std::__cxx11::string::string((string *)&local_160,(string *)&encodedKey);
    std::__cxx11::string::operator=((string *)this,(string *)&local_160);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    llvm::SmallVectorImpl<unsigned_char>::~SmallVectorImpl
              ((SmallVectorImpl<unsigned_char> *)&encoder);
    return;
  }
  __assert_fail("encodedKey.size() == pos",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildKey.h"
                ,0x67,
                "llbuild::buildsystem::BuildKey::BuildKey(char, StringRef, const BinaryEncodable &) [BinaryEncodable = llvm::StringRef]"
               );
}

Assistant:

BuildKey(char kindCode, StringRef name, const BinaryEncodable& data) {
    uint32_t nameSize = name.size();

    // FIXME: Perhaps should use this encoder for the key itself? Right now
    // we're manually building the keys and causing some extra memcpy overhead
    // here.
    basic::BinaryEncoder encoder;
    encoder.write(data);
    uint32_t dataSize = encoder.contents().size();

    std::string encodedKey;
    encodedKey.resize(1 + sizeof(uint32_t) + nameSize + dataSize);
    uint32_t pos = 0;
    encodedKey[pos] = kindCode; pos += 1;
    memcpy(&encodedKey[pos], &nameSize, sizeof(uint32_t));
    pos += sizeof(uint32_t);
    memcpy(&encodedKey[pos], name.data(), nameSize);
    pos += nameSize;
    memcpy(&encodedKey[pos], encoder.contents().data(), dataSize);
    pos += dataSize;
    assert(encodedKey.size() == pos);
    (void)pos;
    key = encodedKey;
  }